

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guha_join_ti_impl.h
# Opt level: O0

void __thiscall
join::
GuhaJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::execute_rsc_join(GuhaJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
                   *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                         *trees_collection,
                  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
                  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>
                  *join_result,double distance_threshold)

{
  pointer *__return_storage_ptr__;
  allocator<std::vector<double,_std::allocator<double>_>_> *this_00;
  size_type sVar1;
  size_type sVar2;
  allocator<std::vector<double,_std::allocator<double>_>_> local_c2;
  allocator<double> local_c1;
  vector<double,_std::allocator<double>_> local_c0;
  undefined1 local_a8 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ub_vectors;
  allocator<double> local_79;
  vector<double,_std::allocator<double>_> local_78;
  undefined1 local_60 [8];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  lb_vectors;
  vector<int,_std::allocator<int>_> reference_set;
  double distance_threshold_local;
  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *join_result_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates_local;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  *trees_collection_local;
  GuhaJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
  *this_local;
  
  __return_storage_ptr__ =
       &lb_vectors.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  get_reference_set((vector<int,_std::allocator<int>_> *)__return_storage_ptr__,this,
                    trees_collection,distance_threshold);
  sVar1 = std::
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
          size(trees_collection);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)__return_storage_ptr__);
  std::allocator<double>::allocator(&local_79);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,sVar2,&local_79);
  this_00 = (allocator<std::vector<double,_std::allocator<double>_>_> *)
            ((long)&ub_vectors.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_60,sVar1,&local_78,this_00);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)
             ((long)&ub_vectors.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<double,_std::allocator<double>_>::~vector(&local_78);
  std::allocator<double>::~allocator(&local_79);
  sVar1 = std::
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
          size(trees_collection);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &lb_vectors.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<double>::allocator(&local_c1);
  std::vector<double,_std::allocator<double>_>::vector(&local_c0,sVar2,&local_c1);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_c2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)local_a8,sVar1,&local_c0,&local_c2);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_c2);
  std::vector<double,_std::allocator<double>_>::~vector(&local_c0);
  std::allocator<double>::~allocator(&local_c1);
  compute_vectors(this,trees_collection,
                  (vector<int,_std::allocator<int>_> *)
                  &lb_vectors.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_60,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)local_a8);
  retrieve_metric_candidates
            (this,candidates,join_result,distance_threshold,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_60,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)local_a8);
  retrieve_sc_candidates(this,trees_collection,candidates,join_result,distance_threshold);
  verify_candidates(this,trees_collection,candidates,join_result,distance_threshold);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_a8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_60);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &lb_vectors.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void GuhaJoinTI<Label, VerificationAlgorithm>::execute_rsc_join(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, int>>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {
  
  std::vector<int> reference_set = get_reference_set(
      trees_collection, distance_threshold
  );
  
  std::vector<std::vector<double>> lb_vectors(trees_collection.size(), std::vector<double>(reference_set.size()));
  std::vector<std::vector<double>> ub_vectors(trees_collection.size(), std::vector<double>(reference_set.size()));
  
  // Compute the vectors.
  compute_vectors(trees_collection, reference_set, lb_vectors, ub_vectors);
  
  // Retrieves candidates from the candidate index.
  retrieve_metric_candidates(candidates, join_result, distance_threshold, lb_vectors, ub_vectors);
  retrieve_sc_candidates(trees_collection, candidates, join_result, distance_threshold);

  // Verify all computed join candidates and return the join result.
  verify_candidates(trees_collection, candidates, join_result, distance_threshold);
}